

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O0

bool __thiscall JSON::forEachArrayItem(JSON *this,function<void_(JSON)> *fn)

{
  bool bVar1;
  element_type *this_00;
  pointer pJVar2;
  long local_90;
  long local_88;
  JSON local_58;
  reference local_48;
  JSON *i;
  const_iterator __end2;
  const_iterator __begin2;
  vector<JSON,_std::allocator<JSON>_> *__range2;
  JSON_array *v;
  function<void_(JSON)> *fn_local;
  JSON *this_local;
  
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)this);
  if (bVar1) {
    this_00 = std::__shared_ptr_access<JSON::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<JSON::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
    pJVar2 = std::unique_ptr<JSON::JSON_value,_std::default_delete<JSON::JSON_value>_>::get
                       (&this_00->value);
    if (pJVar2 == (pointer)0x0) {
      local_88 = 0;
    }
    else {
      local_88 = __dynamic_cast(pJVar2,&JSON_value::typeinfo,&JSON_array::typeinfo,0);
    }
    local_90 = local_88;
  }
  else {
    local_90 = 0;
  }
  if (local_90 == 0) {
    this_local._7_1_ = false;
  }
  else {
    __end2 = std::vector<JSON,_std::allocator<JSON>_>::begin
                       ((vector<JSON,_std::allocator<JSON>_> *)(local_90 + 0x10));
    i = (JSON *)std::vector<JSON,_std::allocator<JSON>_>::end
                          ((vector<JSON,_std::allocator<JSON>_> *)(local_90 + 0x10));
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<const_JSON_*,_std::vector<JSON,_std::allocator<JSON>_>_>
                                  *)&i);
      if (!bVar1) break;
      local_48 = __gnu_cxx::
                 __normal_iterator<const_JSON_*,_std::vector<JSON,_std::allocator<JSON>_>_>::
                 operator*(&__end2);
      JSON(&local_58,local_48);
      std::function<void_(JSON)>::operator()(fn,&local_58);
      ~JSON(&local_58);
      __gnu_cxx::__normal_iterator<const_JSON_*,_std::vector<JSON,_std::allocator<JSON>_>_>::
      operator++(&__end2);
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool
JSON::forEachArrayItem(std::function<void(JSON value)> fn) const
{
    if (auto v = m ? dynamic_cast<JSON_array const*>(m->value.get()) : nullptr) {
        for (auto const& i: v->elements) {
            fn(JSON(i));
        }
        return true;
    }
    return false;
}